

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageFill(gdImagePtr im,int x,int y,int nc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int *ptr;
  int *piVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int *piVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  char *pcVar20;
  int *local_a0;
  int *local_98;
  
  if ((im->trueColor == 0) && (im->colorsTotal <= nc)) {
    return;
  }
  iVar1 = im->alphaBlendingFlag;
  im->alphaBlendingFlag = 0;
  if (nc == -5) {
    if (im->tile == (gdImageStruct *)0x0) goto LAB_0010ef0f;
    iVar9 = im->sx;
    iVar2 = im->sy;
    iVar5 = overflow2(iVar2,iVar9);
    if (iVar5 != 0) goto LAB_0010ef0f;
    iVar6 = im->sx * im->sy;
    iVar5 = iVar6 + 3;
    if (-1 < iVar6) {
      iVar5 = iVar6;
    }
    iVar5 = overflow2(0x10,iVar5 >> 2);
    if ((iVar5 != 0) || (ptr = (int *)gdCalloc((long)im->sx * (long)im->sy,1), ptr == (int *)0x0))
    goto LAB_0010ef0f;
    iVar6 = im->sx * im->sy;
    iVar5 = iVar6 + 3;
    if (-1 < iVar6) {
      iVar5 = iVar6;
    }
    piVar11 = (int *)gdMalloc((long)(iVar5 >> 2) << 4);
    if (piVar11 != (int *)0x0) {
      lVar19 = (long)iVar2;
      iVar5 = gdImageGetPixel(im,x,y);
      iVar6 = im->sx * im->sy;
      piVar15 = piVar11;
      if ((y + 1 < iVar2 && -2 < y) && 3 < iVar6) {
        *piVar11 = y;
        piVar11[1] = x;
        piVar11[2] = x;
        piVar11[3] = 1;
        piVar15 = piVar11 + 4;
      }
      iVar10 = iVar6 + 3;
      if (-1 < iVar6) {
        iVar10 = iVar6;
      }
      if ((piVar15 < piVar11 + (long)(iVar10 >> 2) * 4) && (y < iVar2 && -1 < y)) {
        *piVar15 = y + 1;
        piVar15[1] = x;
        piVar15[2] = x;
        piVar15[3] = -1;
        piVar15 = piVar15 + 4;
      }
      if (piVar11 < piVar15) {
LAB_0010e871:
        iVar6 = piVar15[-4];
        iVar10 = piVar15[-1];
        iVar16 = iVar10 + iVar6;
        iVar8 = piVar15[-3];
        lVar14 = (long)iVar8;
        iVar3 = piVar15[-2];
        lVar12 = (long)iVar16;
        iVar7 = iVar8;
        if (-1 < lVar14) {
          pcVar20 = (char *)(lVar19 * lVar14 + lVar12 + (long)ptr);
          do {
            if (*pcVar20 != '\0') goto LAB_0010e910;
            iVar18 = (int)lVar14;
            iVar7 = gdImageGetPixel(im,iVar18,iVar16);
            if (iVar7 != iVar5) goto LAB_0010e910;
            iVar7 = gdImageTileGet(im,iVar18,iVar16);
            *pcVar20 = '\x01';
            gdImageSetPixel(im,iVar18,iVar16,iVar7);
            pcVar20 = pcVar20 + -lVar19;
            bVar4 = 0 < lVar14;
            lVar14 = lVar14 + -1;
          } while (bVar4);
          lVar14 = 0xffffffff;
LAB_0010e910:
          iVar7 = (int)lVar14;
        }
        local_a0 = piVar15 + -4;
        if (iVar8 <= iVar7) goto LAB_0010eaa1;
        iVar18 = iVar7 + 1;
        if (iVar18 < iVar8) {
          iVar13 = im->sx * im->sy;
          iVar7 = iVar13 + 3;
          if (-1 < iVar13) {
            iVar7 = iVar13;
          }
          if ((local_a0 < piVar11 + (long)(iVar7 >> 2) * 4) && (iVar6 < iVar2 && -1 < iVar6)) {
            piVar15[-4] = iVar16;
            piVar15[-3] = iVar18;
            piVar15[-2] = iVar8 + -1;
            piVar15[-1] = -iVar10;
            local_a0 = piVar15;
          }
        }
        iVar7 = iVar8 + 1;
        do {
          if (iVar7 < iVar9) {
            lVar14 = (long)iVar7;
            lVar17 = iVar9 - lVar14;
            pcVar20 = (char *)(lVar19 * lVar14 + lVar12 + (long)ptr);
            do {
              iVar7 = (int)lVar14;
              if ((*pcVar20 != '\0') || (iVar8 = gdImageGetPixel(im,iVar7,iVar16), iVar8 != iVar5))
              break;
              iVar8 = gdImageTileGet(im,iVar7,iVar16);
              *pcVar20 = '\x01';
              gdImageSetPixel(im,iVar7,iVar16,iVar8);
              lVar14 = lVar14 + 1;
              pcVar20 = pcVar20 + lVar19;
              lVar17 = lVar17 + -1;
              iVar7 = iVar9;
            } while (lVar17 != 0);
          }
          iVar13 = im->sx * im->sy;
          iVar8 = iVar13 + 3;
          if (-1 < iVar13) {
            iVar8 = iVar13;
          }
          if ((local_a0 < piVar11 + (long)(iVar8 >> 2) * 4) &&
             (iVar16 + iVar10 < iVar2 && -1 < iVar16 + iVar10)) {
            *local_a0 = iVar16;
            local_a0[1] = iVar18;
            local_a0[2] = iVar7 + -1;
            local_a0[3] = iVar10;
            local_a0 = local_a0 + 4;
          }
          if (((iVar3 + 1 < iVar7) && (local_a0 < piVar11 + (long)(iVar8 >> 2) * 4)) &&
             (iVar6 < iVar2 && -1 < iVar6)) {
            *local_a0 = iVar16;
            local_a0[1] = iVar3 + 1;
            local_a0[2] = iVar7 + -1;
            local_a0[3] = -iVar10;
            local_a0 = local_a0 + 4;
          }
LAB_0010eaa1:
          if (iVar3 <= iVar7) goto LAB_0010eaf7;
          lVar14 = (long)iVar3 - (long)iVar7;
          pcVar20 = (char *)((long)ptr + ((long)iVar7 + 1) * lVar19 + lVar12);
          iVar18 = iVar7;
          while ((iVar18 = iVar18 + 1, *pcVar20 != '\0' ||
                 (iVar8 = gdImageGetPixel(im,iVar18,iVar16), iVar7 = iVar18, iVar8 != iVar5))) {
            pcVar20 = pcVar20 + lVar19;
            lVar14 = lVar14 + -1;
            if (lVar14 == 0) goto LAB_0010eaf7;
          }
        } while( true );
      }
LAB_0010eef2:
      gdFree(ptr);
      ptr = piVar11;
    }
  }
  else {
    iVar9 = im->sx;
    iVar2 = im->sy;
    iVar5 = gdImageGetPixel(im,x,y);
    if ((x < 0 || iVar5 == nc) || (iVar2 < y || (y < 0 || iVar9 < x))) goto LAB_0010ef0f;
    iVar6 = x;
    if (iVar9 < 4) {
      do {
        iVar9 = gdImageGetPixel(im,iVar6,y);
        if (iVar9 != iVar5) break;
        gdImageSetPixel(im,iVar6,y,nc);
        bVar4 = iVar6 < im->sx + -1;
        iVar6 = iVar6 + 1;
      } while ((bVar4) || (bVar4 = y < im->sy + -1, iVar6 = x, y = y + 1, bVar4));
      goto LAB_0010ef0f;
    }
    iVar6 = overflow2(iVar2,iVar9);
    if (iVar6 != 0) {
      return;
    }
    iVar10 = im->sx * im->sy;
    iVar6 = iVar10 + 3;
    if (-1 < iVar10) {
      iVar6 = iVar10;
    }
    iVar6 = overflow2(0x10,iVar6 >> 2);
    if (iVar6 != 0) {
      return;
    }
    iVar10 = im->sx * im->sy;
    iVar6 = iVar10 + 3;
    if (-1 < iVar10) {
      iVar6 = iVar10;
    }
    ptr = (int *)gdMalloc((long)(iVar6 >> 2) << 4);
    if (ptr == (int *)0x0) {
      return;
    }
    iVar6 = im->sx * im->sy;
    local_98 = ptr;
    if (y + 1 < iVar2 && 3 < iVar6) {
      *ptr = y;
      ptr[1] = x;
      ptr[2] = x;
      ptr[3] = 1;
      local_98 = ptr + 4;
    }
    iVar10 = iVar6 + 3;
    if (-1 < iVar6) {
      iVar10 = iVar6;
    }
    if (y < iVar2 && local_98 < ptr + (long)(iVar10 >> 2) * 4) {
      *local_98 = y + 1;
      local_98[1] = x;
      local_98[2] = x;
      local_98[3] = -1;
      local_98 = local_98 + 4;
    }
    if (ptr < local_98) {
LAB_0010eccc:
      iVar6 = local_98[-4];
      iVar10 = local_98[-3];
      iVar8 = local_98[-1];
      iVar16 = iVar8 + iVar6;
      iVar3 = local_98[-2];
      iVar7 = iVar10;
      if (-1 < iVar10) {
        do {
          iVar18 = gdImageGetPixel(im,iVar7,iVar16);
          if (iVar18 != iVar5) goto LAB_0010ed39;
          gdImageSetPixel(im,iVar7,iVar16,nc);
          bVar4 = 0 < iVar7;
          iVar7 = iVar7 + -1;
        } while (bVar4);
        iVar7 = -1;
      }
LAB_0010ed39:
      piVar11 = local_98 + -4;
      if (iVar10 <= iVar7) goto LAB_0010eea5;
      iVar7 = iVar7 + 1;
      if (iVar7 < iVar10) {
        iVar13 = im->sx * im->sy;
        iVar18 = iVar13 + 3;
        if (-1 < iVar13) {
          iVar18 = iVar13;
        }
        if ((piVar11 < ptr + (long)(iVar18 >> 2) * 4) && (iVar6 < iVar2 && -1 < iVar6)) {
          local_98[-4] = iVar16;
          local_98[-3] = iVar7;
          local_98[-2] = iVar10 + -1;
          local_98[-1] = -iVar8;
          piVar11 = local_98;
        }
      }
      iVar10 = iVar10 + 1;
      local_98 = piVar11;
      do {
        if (iVar10 <= iVar9) {
          do {
            iVar18 = gdImageGetPixel(im,iVar10,iVar16);
            if (iVar18 != iVar5) break;
            gdImageSetPixel(im,iVar10,iVar16,nc);
            iVar10 = iVar10 + 1;
          } while (iVar9 + 1 != iVar10);
        }
        iVar13 = im->sx * im->sy;
        iVar18 = iVar13 + 3;
        if (-1 < iVar13) {
          iVar18 = iVar13;
        }
        if ((local_98 < ptr + (long)(iVar18 >> 2) * 4) &&
           (iVar16 + iVar8 < iVar2 && -1 < iVar16 + iVar8)) {
          *local_98 = iVar16;
          local_98[1] = iVar7;
          local_98[2] = iVar10 + -1;
          local_98[3] = iVar8;
          local_98 = local_98 + 4;
        }
        iVar7 = iVar10;
        piVar11 = local_98;
        if (((iVar3 + 1 < iVar10) && (local_98 < ptr + (long)(iVar18 >> 2) * 4)) &&
           (iVar6 < iVar2 && -1 < iVar6)) {
          *local_98 = iVar16;
          local_98[1] = iVar3 + 1;
          local_98[2] = iVar10 + -1;
          local_98[3] = -iVar8;
          piVar11 = local_98 + 4;
        }
LAB_0010eea5:
        local_98 = piVar11;
        iVar18 = iVar3;
        if (iVar3 < iVar7) {
          iVar18 = iVar7;
        }
        do {
          if (iVar18 == iVar7) {
            if (ptr < local_98) goto LAB_0010eccc;
            goto LAB_0010ef07;
          }
          iVar7 = iVar7 + 1;
          iVar13 = gdImageGetPixel(im,iVar7,iVar16);
          iVar10 = iVar7;
        } while (iVar13 != iVar5);
      } while( true );
    }
  }
LAB_0010ef07:
  gdFree(ptr);
LAB_0010ef0f:
  im->alphaBlendingFlag = iVar1;
  return;
LAB_0010eaf7:
  piVar15 = local_a0;
  if (local_a0 <= piVar11) goto LAB_0010eef2;
  goto LAB_0010e871;
}

Assistant:

BGD_DECLARE(void) gdImageFill(gdImagePtr im, int x, int y, int nc)
{
	int l, x1, x2, dy;
	int oc;   /* old pixel value */
	int wx2,wy2;

	int alphablending_bak;

	/* stack of filled segments */
	/* struct seg stack[FILL_MAX],*sp = stack; */
	struct seg *stack;
	struct seg *sp;

	if (!im->trueColor && nc > (im->colorsTotal - 1)) {
		return;
	}

	alphablending_bak = im->alphaBlendingFlag;
	im->alphaBlendingFlag = 0;

	if (nc==gdTiled) {
		_gdImageFillTiled(im,x,y,nc);
		im->alphaBlendingFlag = alphablending_bak;
		return;
	}

	wx2=im->sx;
	wy2=im->sy;
	oc = gdImageGetPixel(im, x, y);
	if (oc==nc || x<0 || x>wx2 || y<0 || y>wy2) {
		im->alphaBlendingFlag = alphablending_bak;
		return;
	}

	/* Do not use the 4 neighbors implementation with
	* small images
	*/
	if (im->sx < 4) {
		int ix = x, iy = y, c;
		do {
			do {
				c = gdImageGetPixel(im, ix, iy);
				if (c != oc) {
					goto done;
				}
				gdImageSetPixel(im, ix, iy, nc);
			} while(ix++ < (im->sx -1));
			ix = x;
		} while(iy++ < (im->sy -1));
		goto done;
	}

	if(overflow2(im->sy, im->sx)) {
		return;
	}

	if(overflow2(sizeof(struct seg), ((im->sy * im->sx) / 4))) {
		return;
	}

	stack = (struct seg *)gdMalloc(sizeof(struct seg) * ((int)(im->sy*im->sx)/4));
	if (!stack) {
		return;
	}
	sp = stack;

	/* required! */
	FILL_PUSH(y,x,x,1);
	/* seed segment (popped 1st) */
	FILL_PUSH(y+1, x, x, -1);
	while (sp>stack) {
		FILL_POP(y, x1, x2, dy);

		for (x=x1; x>=0 && gdImageGetPixel(im,x, y)==oc; x--) {
			gdImageSetPixel(im,x, y, nc);
		}
		if (x>=x1) {
			goto skip;
		}
		l = x+1;

		/* leak on left? */
		if (l<x1) {
			FILL_PUSH(y, l, x1-1, -dy);
		}
		x = x1+1;
		do {
			for (; x<=wx2 && gdImageGetPixel(im,x, y)==oc; x++) {
				gdImageSetPixel(im, x, y, nc);
			}
			FILL_PUSH(y, l, x-1, dy);
			/* leak on right? */
			if (x>x2+1) {
				FILL_PUSH(y, x2+1, x-1, -dy);
			}
skip:
			for (x++; x<=x2 && (gdImageGetPixel(im, x, y)!=oc); x++);

			l = x;
		} while (x<=x2);
	}

	gdFree(stack);

done:
	im->alphaBlendingFlag = alphablending_bak;
}